

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O0

void duckdb::ArrowJson::PopulateSchema
               (DuckDBArrowSchemaHolder *root_holder,ArrowSchema *schema,LogicalType *type,
               ClientContext *context,ArrowTypeExtension *extension)

{
  ArrowSchemaMetadata *this;
  pointer pcVar1;
  undefined8 *in_RSI;
  long in_RDI;
  ClientContext *in_stack_00000008;
  ClientProperties options;
  ArrowSchemaMetadata schema_metadata;
  ArrowTypeExtension *in_stack_fffffffffffffe98;
  ArrowExtensionMetadata *in_stack_fffffffffffffea0;
  unique_ptr<char[],_std::default_delete<char>,_false> *__args;
  vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  *in_stack_fffffffffffffeb0;
  char local_130;
  byte local_12e;
  vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>
  *in_stack_fffffffffffffee0;
  unique_ptr<char[],_std::default_delete<char>,_false> local_108 [8];
  ArrowSchemaMetadata *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff48;
  string local_88 [120];
  undefined8 *local_10;
  long local_8;
  
  __args = local_108;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ArrowTypeExtension::GetInfo(in_stack_fffffffffffffe98);
  ArrowExtensionMetadata::GetExtensionName_abi_cxx11_
            ((ArrowExtensionMetadata *)in_stack_fffffffffffffe98);
  ArrowSchemaMetadata::ArrowCanonicalType(in_stack_ffffffffffffff48);
  ::std::__cxx11::string::~string(local_88);
  ArrowExtensionMetadata::~ArrowExtensionMetadata(in_stack_fffffffffffffea0);
  this = (ArrowSchemaMetadata *)(local_8 + 0x90);
  ArrowSchemaMetadata::SerializeMetadata(in_stack_ffffffffffffff38);
  ::std::
  vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
  ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
            (in_stack_fffffffffffffeb0,__args);
  unique_ptr<char[],_std::default_delete<char>,_false>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char>,_false> *)0x152e5da);
  vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
            (in_stack_fffffffffffffee0);
  pcVar1 = ::std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)this);
  local_10[2] = pcVar1;
  ClientContext::GetClientProperties(in_stack_00000008);
  if ((local_12e & 1) == 0) {
    if (local_130 == '\x01') {
      *local_10 = "U";
    }
    else {
      *local_10 = "u";
    }
  }
  else {
    *local_10 = "vu";
  }
  ClientProperties::~ClientProperties((ClientProperties *)0x152e6db);
  ArrowSchemaMetadata::~ArrowSchemaMetadata(this);
  return;
}

Assistant:

static void PopulateSchema(DuckDBArrowSchemaHolder &root_holder, ArrowSchema &schema, const LogicalType &type,
	                           ClientContext &context, const ArrowTypeExtension &extension) {
		const ArrowSchemaMetadata schema_metadata =
		    ArrowSchemaMetadata::ArrowCanonicalType(extension.GetInfo().GetExtensionName());
		root_holder.metadata_info.emplace_back(schema_metadata.SerializeMetadata());
		schema.metadata = root_holder.metadata_info.back().get();
		const auto options = context.GetClientProperties();
		if (options.produce_arrow_string_view) {
			schema.format = "vu";
		} else {
			if (options.arrow_offset_size == ArrowOffsetSize::LARGE) {
				schema.format = "U";
			} else {
				schema.format = "u";
			}
		}
	}